

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop_attribute.c
# Opt level: O2

void prf_pop_attribute_exit_f(prf_node_t *node,prf_state_t *state)

{
  if (node->opcode == prf_pop_attribute_info.opcode) {
    state->attribute_level = state->attribute_level - 1;
    return;
  }
  prf_error(9,"tried pop attribute exit state method on node of type %d.");
  return;
}

Assistant:

static
void
prf_pop_attribute_exit_f(
    prf_node_t * node,
    prf_state_t * state )
{
    assert( state != NULL && node != NULL );
    if ( node->opcode != prf_pop_attribute_info.opcode ) {
        prf_error( 9,
            "tried pop attribute exit state method on node of type %d.",
            node->opcode );
        return;
    }
    state->attribute_level--;
}